

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bignum.c
# Opt level: O3

sexp sexp_make_unsigned_integer_from_luint(sexp ctx,sexp_luint_t x)

{
  sexp psVar1;
  sexp in_RDX;
  ulong in_RSI;
  
  if (in_RSI >> 0x3e == 0 && in_RDX == (sexp)0x0) {
    psVar1 = (sexp)(in_RSI * 2 + 1);
  }
  else if (in_RDX == (sexp)0x0) {
    psVar1 = sexp_alloc_tagged_aux(ctx,0x20,0xc);
    if ((((ulong)psVar1 & 3) != 0) || (psVar1->tag != 0x13)) {
      (psVar1->value).string.offset = 1;
    }
    (psVar1->value).flonum_bits[0] = '\x01';
    (psVar1->value).string.length = in_RSI;
  }
  else {
    psVar1 = sexp_alloc_tagged_aux(ctx,0x28,0xc);
    if ((((ulong)psVar1 & 3) != 0) || (psVar1->tag != 0x13)) {
      (psVar1->value).string.offset = 2;
    }
    (psVar1->value).flonum_bits[0] = '\x01';
    (psVar1->value).string.length = in_RSI;
    (psVar1->value).type.getters = in_RDX;
  }
  return psVar1;
}

Assistant:

sexp sexp_make_unsigned_integer_from_luint (sexp ctx, sexp_luint_t x) {
  sexp res;
  if (luint_is_fixnum(x)) {
    res = sexp_make_fixnum(luint_to_uint(x));
  } else if (sexp_luint_fits_uint(x)) {
    res = sexp_make_bignum(ctx, 1);
    sexp_bignum_sign(res) = 1;
    sexp_bignum_data(res)[0] = luint_to_uint(x);
  } else {
    res = sexp_make_bignum(ctx, 2);
    sexp_bignum_sign(res) = 1;
    sexp_bignum_data(res)[0] = luint_to_uint(x);
    sexp_bignum_data(res)[1] = luint_to_uint_hi(x);
  }
  return res;
}